

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O0

void __thiscall pg::PTLSolver::run(PTLSolver *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  int *piVar9;
  size_t sVar10;
  uintqueue *puVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  ostream *poVar15;
  reference ppiVar16;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar17;
  ulong uVar18;
  vector<int,_std::allocator<int>_> *local_f8;
  int **x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int_*,_std::allocator<int_*>_> *__range1_1;
  int **x;
  iterator __end1;
  iterator __begin1;
  vector<int_*,_std::allocator<int_*>_> *__range1;
  int i;
  PTLSolver *this_local;
  
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  uVar6 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar7 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar18 = uVar7 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar7) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar18);
  *puVar8 = uVar6;
  pvVar17 = (vector<int,_std::allocator<int>_> *)(puVar8 + 1);
  if (uVar6 != 0) {
    local_f8 = pvVar17;
    do {
      std::vector<int,_std::allocator<int>_>::vector(local_f8);
      local_f8 = local_f8 + 1;
    } while (local_f8 != pvVar17 + uVar6);
  }
  this->tin = pvVar17;
  uVar6 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  uVar6 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar9 = (int *)operator_new__(uVar6);
  this->str = piVar9;
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->H,sVar10);
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->S0,sVar10);
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->S1,sVar10);
  bitset::operator=(&this->G,(this->super_Solver).disabled);
  bitset::flip(&this->G);
  puVar11 = &this->Q;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->Q).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->SolvedQ0;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->SolvedQ0).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->SolvedQ1;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->SolvedQ1).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->Zvec;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->Zvec).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->tangleto;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->tangleto).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->bs_exits,sVar10);
  puVar11 = &this->pea_vS;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->pea_vS).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->pea_iS;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->pea_iS).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  puVar11 = &this->pea_S;
  lVar12 = Solver::nodecount(&this->super_Solver);
  (this->pea_S).pointer = 0;
  if ((puVar11->queue != (uint *)0x0) && (puVar11->queue != (uint *)0x0)) {
    operator_delete__(puVar11->queue);
  }
  auVar2 = ZEXT416((uint)lVar12) * ZEXT816(4);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar13 = (uint *)operator_new__(uVar6);
  puVar11->queue = puVar13;
  uVar6 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  uVar6 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar14 = (uint *)operator_new__(uVar6);
  this->pea_vidx = puVar14;
  sVar10 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->pea_root,sVar10);
  solve(this);
  poVar15 = std::operator<<((this->super_Solver).logger,"found ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->dominions);
  poVar15 = std::operator<<(poVar15," dominions.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  poVar15 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->tangles);
  poVar15 = std::operator<<(poVar15," tangles and ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->iterations);
  poVar15 = std::operator<<(poVar15," iterations.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  __range1._4_4_ = 0;
  while( true ) {
    lVar12 = Solver::nodecount(&this->super_Solver);
    if (lVar12 <= __range1._4_4_) {
      __end1 = std::vector<int_*,_std::allocator<int_*>_>::begin(&this->tv);
      x = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(&this->tv);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                         *)&x), bVar5) {
        ppiVar16 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                   ::operator*(&__end1);
        if (*ppiVar16 != (int *)0x0) {
          operator_delete__(*ppiVar16);
        }
        __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
        operator++(&__end1);
      }
      __end1_1 = std::vector<int_*,_std::allocator<int_*>_>::begin(&this->tout);
      x_1 = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(&this->tout);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                 *)&x_1), bVar5) {
        ppiVar16 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                   ::operator*(&__end1_1);
        if (*ppiVar16 != (int *)0x0) {
          operator_delete__(*ppiVar16);
        }
        __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
        operator++(&__end1_1);
      }
      pvVar17 = this->tin;
      if (pvVar17 != (vector<int,_std::allocator<int>_> *)0x0) {
        piVar1 = pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        this_00 = pvVar17 + (long)piVar1;
        while (pvVar17 != this_00) {
          this_00 = this_00 + -1;
          std::vector<int,_std::allocator<int>_>::~vector(this_00);
        }
        operator_delete__(&pvVar17[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)piVar1 * 0x18 + 8);
      }
      if (this->str != (int *)0x0) {
        operator_delete__(this->str);
      }
      if (this->pea_vidx != (uint *)0x0) {
        operator_delete__(this->pea_vidx);
      }
      return;
    }
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)__range1._4_4_);
    if (!bVar5) break;
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  poVar15 = std::operator<<((this->super_Solver).logger,"search was incomplete!");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void
PTLSolver::run()
{
    iterations = 0;
    dominions = 0;
    tangles = 0;

    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    H.resize(nodecount());
    S0.resize(nodecount());
    S1.resize(nodecount());
    G = disabled;
    G.flip();

    Q.resize(nodecount());
    SolvedQ0.resize(nodecount());
    SolvedQ1.resize(nodecount());
    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    bs_exits.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    solve();

    logger << "found " << dominions << " dominions." << std::endl;
    logger << "solved with " << tangles << " tangles and " << iterations << " iterations." << std::endl;

    // check if actually all solved
#ifndef NDEBUG
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { logger << "search was incomplete!" << std::endl; exit(-1); }
    }
#endif

    // delete[] tangles
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
}